

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O0

Matrix<Complex> Matrix<Complex>::fromNumber(Complex *f)

{
  Complex *pCVar1;
  Complex *extraout_RDX;
  Complex *in_RSI;
  undefined8 in_RDI;
  Matrix<Complex> MVar2;
  Matrix<Complex> *unaff_retaddr;
  Matrix<Complex> *a;
  Matrix<Complex> *in_stack_ffffffffffffffa8;
  MatrixRow<Complex_&> local_20;
  undefined1 local_11;
  
  local_11 = 0;
  Matrix(unaff_retaddr,(uint)((ulong)in_RDI >> 0x20),(uint)in_RDI);
  local_20.arr = (Complex *)operator[](in_stack_ffffffffffffffa8,0);
  pCVar1 = MatrixRow<Complex_&>::operator[](&local_20,0);
  Complex::operator=(in_RSI,pCVar1);
  MVar2.arr = extraout_RDX;
  MVar2._0_8_ = in_RDI;
  return MVar2;
}

Assistant:

inline static const Matrix fromNumber(Field f)
    {
        Matrix a(1, 1);
        a[0][0] = f;
        return a;
    }